

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.h
# Opt level: O0

void __thiscall
YAML::EmitterState::_Set<unsigned_long>
          (EmitterState *this,Setting<unsigned_long> *fmt,unsigned_long value,value scope)

{
  int in_ECX;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>
  *in_stack_ffffffffffffff78;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *pSettingChange
  ;
  SettingChanges *in_stack_ffffffffffffff80;
  SettingChanges *this_00;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>
  *in_stack_ffffffffffffff90;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *this_01;
  uint in_stack_ffffffffffffffb0;
  __uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>
  in_stack_ffffffffffffffb8;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> local_40 [5];
  SettingChanges local_18;
  
  if (in_ECX == 0) {
    Setting<unsigned_long>::set
              ((Setting<unsigned_long> *)
               in_stack_ffffffffffffffb8._M_t.
               super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
               .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl,
               (unsigned_long *)(ulong)in_stack_ffffffffffffffb0);
    SettingChanges::push(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>::
    ~unique_ptr(in_stack_ffffffffffffff90);
  }
  else if (in_ECX == 1) {
    pSettingChange = local_40;
    this_00 = &local_18;
    Setting<unsigned_long>::set
              ((Setting<unsigned_long> *)
               in_stack_ffffffffffffffb8._M_t.
               super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
               .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl,
               (unsigned_long *)CONCAT44(1,in_stack_ffffffffffffffb0));
    std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>::
    ~unique_ptr(in_stack_ffffffffffffff90);
    this_01 = (unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *)
              &stack0xffffffffffffffb8;
    Setting<unsigned_long>::set
              ((Setting<unsigned_long> *)
               in_stack_ffffffffffffffb8._M_t.
               super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
               .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl,
               (unsigned_long *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0));
    SettingChanges::push(this_00,pSettingChange);
    std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>::
    ~unique_ptr(this_01);
  }
  return;
}

Assistant:

void EmitterState::_Set(Setting<T>& fmt, T value, FmtScope::value scope) {
  switch (scope) {
    case FmtScope::Local:
      m_modifiedSettings.push(fmt.set(value));
      break;
    case FmtScope::Global:
      fmt.set(value);
      m_globalModifiedSettings.push(
          fmt.set(value));  // this pushes an identity set, so when we restore,
      // it restores to the value here, and not the previous one
      break;
    default:
      assert(false);
  }
}